

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
__thiscall
duckdb::StandardColumnData::CreateCheckpointState
          (StandardColumnData *this,RowGroup *row_group,PartialBlockManager *partial_block_manager)

{
  _func_int **in_RAX;
  PartialBlockManager *in_RCX;
  _func_int **local_18;
  
  local_18 = in_RAX;
  make_uniq<duckdb::StandardColumnCheckpointState,duckdb::RowGroup&,duckdb::StandardColumnData&,duckdb::PartialBlockManager&>
            ((duckdb *)&local_18,(RowGroup *)partial_block_manager,(StandardColumnData *)row_group,
             in_RCX);
  (this->super_ColumnData)._vptr_ColumnData = local_18;
  return (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
          )(unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
            )this;
}

Assistant:

unique_ptr<ColumnCheckpointState>
StandardColumnData::CreateCheckpointState(RowGroup &row_group, PartialBlockManager &partial_block_manager) {
	return make_uniq<StandardColumnCheckpointState>(row_group, *this, partial_block_manager);
}